

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

TokenDetail * __thiscall anon_unknown.dwarf_53533::ParserImpl::NextToken(ParserImpl *this)

{
  long in_RDI;
  TokenDetail *in_stack_000000a0;
  Lexer *in_stack_000000a8;
  
  if (*(int *)(in_RDI + 0x40) == 0x11e) {
    luna::Lexer::GetToken(in_stack_000000a8,in_stack_000000a0);
  }
  else {
    *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x28);
    *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0x30);
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x38);
    *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 0x40);
    *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RDI + 0x48);
    *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RDI + 0x50);
    *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RDI + 0x58);
    *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RDI + 0x60);
    if (*(int *)(in_RDI + 0x60) != 0x11e) {
      *(undefined4 *)(in_RDI + 0x60) = 0x11e;
    }
  }
  return (TokenDetail *)(in_RDI + 8);
}

Assistant:

TokenDetail& NextToken()
        {
            if (look_ahead_.token_ != Token_EOF)
            {
                current_ = look_ahead_;
                look_ahead_ = look_ahead2_;
                if (look_ahead2_.token_ != Token_EOF)
                    look_ahead2_.token_ = Token_EOF;
            }
            else
            {
                lexer_->GetToken(&current_);
            }

            return current_;
        }